

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

void isofile_free(isofile *file)

{
  content_conflict *pcVar1;
  content_conflict *__ptr;
  
  __ptr = (file->content).next;
  while (__ptr != (content_conflict *)0x0) {
    pcVar1 = __ptr->next;
    free(__ptr);
    __ptr = pcVar1;
  }
  archive_entry_free(file->entry);
  archive_string_free(&file->parentdir);
  archive_string_free(&file->basename);
  archive_string_free(&file->basename_utf16);
  archive_string_free(&file->symlink);
  free(file);
  return;
}

Assistant:

static void
isofile_free(struct isofile *file)
{
	struct content *con, *tmp;

	con = file->content.next;
	while (con != NULL) {
		tmp = con;
		con = con->next;
		free(tmp);
	}
	archive_entry_free(file->entry);
	archive_string_free(&(file->parentdir));
	archive_string_free(&(file->basename));
	archive_string_free(&(file->basename_utf16));
	archive_string_free(&(file->symlink));
	free(file);
}